

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

uint gl4cts::Utils::getBaseVariableTypeComponentSize(_variable_type type)

{
  TestError *this;
  uint local_10;
  uint result;
  _variable_type type_local;
  
  switch(type) {
  case VARIABLE_TYPE_BOOL:
    local_10 = 1;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1c9);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case VARIABLE_TYPE_DOUBLE:
    local_10 = 8;
    break;
  case VARIABLE_TYPE_FLOAT:
    local_10 = 4;
    break;
  case VARIABLE_TYPE_INT:
    local_10 = 4;
    break;
  case VARIABLE_TYPE_UINT:
    local_10 = 4;
  }
  return local_10;
}

Assistant:

unsigned int Utils::getBaseVariableTypeComponentSize(_variable_type type)
{
	unsigned int result = 0;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
		result = sizeof(bool);
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = sizeof(double);
		break;
	case VARIABLE_TYPE_FLOAT:
		result = sizeof(float);
		break;
	case VARIABLE_TYPE_INT:
		result = sizeof(int);
		break;
	case VARIABLE_TYPE_UINT:
		result = sizeof(unsigned int);
		break;

	default:
	{
		TCU_FAIL("Unrecognized variable type");
	}
	} /* switch (type) */

	return result;
}